

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O1

void nn_timer_handler(nn_fsm *self,int src,int type,void *srcptr)

{
  int timeout;
  
  if (*(int *)&self[1].fn == 2) {
    if (src == 1) {
      if (type == 1) {
        timeout = *(int *)&self[2].stopped.fsm;
        if (-1 < timeout) {
          nn_worker_add_timer((nn_worker *)self[2].ctx,timeout,
                              (nn_worker_timer *)&self[1].stopped.src);
          *(undefined4 *)&self[2].stopped.fsm = 0xffffffff;
          return;
        }
      }
      else {
        nn_timer_handler_cold_4();
LAB_00132eb7:
        nn_timer_handler_cold_3();
      }
      nn_timer_handler_cold_5();
      goto LAB_00132ec1;
    }
    if (&self[1].stopped.src == (int *)srcptr) {
      if (type != 1) goto LAB_00132ed7;
      if (*(int *)&self[2].stopped.fsm == -1) {
        nn_fsm_raise(self,(nn_fsm_event *)(self + 2),1);
        return;
      }
      goto LAB_00132eb7;
    }
  }
  else {
    if (*(int *)&self[1].fn == 1) {
      if (src != -2) goto LAB_00132ec6;
      if (type == -2) {
        *(undefined4 *)&self[1].fn = 2;
        nn_worker_execute((nn_worker *)self[2].ctx,(nn_worker_task *)&self[1].shutdown_fn);
        return;
      }
    }
    else {
LAB_00132ec1:
      nn_timer_handler_cold_8();
LAB_00132ec6:
      nn_timer_handler_cold_6();
    }
    nn_timer_handler_cold_7();
  }
  nn_timer_handler_cold_1();
LAB_00132ed7:
  nn_timer_handler_cold_2();
}

Assistant:

static void nn_timer_handler (struct nn_fsm *self, int src, int type,
    void *srcptr)
{
    struct nn_timer *timer;

    timer = nn_cont (self, struct nn_timer, fsm);

    switch (timer->state) {

/******************************************************************************/
/*  IDLE state.                                                               */
/******************************************************************************/
    case NN_TIMER_STATE_IDLE:
        switch (src) {
        case NN_FSM_ACTION:
            switch (type) {
            case NN_FSM_START:

                /*  Send start event to the worker thread. */
                timer->state = NN_TIMER_STATE_ACTIVE;
                nn_worker_execute (timer->worker, &timer->start_task);
                return;
            default:
                nn_fsm_bad_action (timer->state, src, type);
            }
        default:
            nn_fsm_bad_source (timer->state, src, type);
        }

/******************************************************************************/
/*  ACTIVE state.                                                             */
/******************************************************************************/
    case NN_TIMER_STATE_ACTIVE:
        if (src == NN_TIMER_SRC_START_TASK) {
            nn_assert (type == NN_WORKER_TASK_EXECUTE);
            nn_assert (timer->timeout >= 0);
            nn_worker_add_timer (timer->worker, timer->timeout,
                &timer->wtimer);
            timer->timeout = -1;
            return;
        }
        if (srcptr == &timer->wtimer) {
            switch (type) {
            case NN_WORKER_TIMER_TIMEOUT:

                /*  Notify the user about the timeout. */
                nn_assert (timer->timeout == -1);
                nn_fsm_raise (&timer->fsm, &timer->done, NN_TIMER_TIMEOUT);
                return;

            default:
                nn_fsm_bad_action (timer->state, src, type);
            }
        }
        nn_fsm_bad_source (timer->state, src, type);

/******************************************************************************/
/*  Invalid state.                                                            */
/******************************************************************************/
    default:
        nn_fsm_bad_state (timer->state, src, type);
    }
}